

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_kill(int pid,int signum)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = kill(pid,signum);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv_kill(int pid, int signum) {
  if (kill(pid, signum)) {
#if defined(__MVS__)
    /* EPERM is returned if the process is a zombie. */
    siginfo_t infop;
    if (errno == EPERM &&
        waitid(P_PID, pid, &infop, WNOHANG | WNOWAIT | WEXITED) == 0)
      return 0;
#endif
    return UV__ERR(errno);
  } else
    return 0;
}